

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall
IR::Instr::ConvertToBailOutInstr
          (Instr *this,Instr *bailOutTarget,BailOutKind kind,uint32 bailOutOffset)

{
  Func *bailOutFunc;
  BailOutInfo *this_00;
  Instr *pIVar1;
  
  bailOutFunc = bailOutTarget->m_func;
  this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,bailOutFunc->m_alloc,0x3d6ef4);
  if (bailOutOffset == 0xffffffff) {
    bailOutOffset = GetByteCodeOffset(bailOutTarget);
  }
  BailOutInfo::BailOutInfo(this_00,bailOutOffset,bailOutFunc);
  this_00->bailOutOpcode = this->m_opcode;
  pIVar1 = ConvertToBailOutInstr(this,this_00,kind,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Instr::ConvertToBailOutInstr(IR::Instr * bailOutTarget, IR::BailOutKind kind, uint32 bailOutOffset)
{
    Func * func = bailOutTarget->m_func;
    BailOutInfo * bailOutInfo = JitAnew(func->m_alloc, BailOutInfo, bailOutOffset == Js::Constants::NoByteCodeOffset ? bailOutTarget->GetByteCodeOffset() : bailOutOffset , func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = this->m_opcode;
#endif
    return this->ConvertToBailOutInstr(bailOutInfo, kind);
}